

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_RandomRHSInNonlinear_Test::TestBody(SPTest_RandomRHSInNonlinear_Test *this)

{
  int iVar1;
  pointer piVar2;
  Reference expr;
  ColProblem *pCVar3;
  MockSpec<void_(int,_double)> *this_00;
  MutAlgebraicCon MVar4;
  LinearConHandler LVar5;
  ColumnSizeHandler cols;
  MatcherBase<double> local_860;
  MatcherBase<int> local_848;
  MockScenarioHandler handler;
  SPAdapter sp;
  TestProblem p;
  NLHeader header;
  
  MakeHeader(&header,2,0);
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&p,&header);
  TestProblem::MakeTestRV(&p);
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,0.0,0.0);
  sp.problem_ = MVar4.
                super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  sp.factory_._vptr_BasicExprFactory._0_4_ =
       MVar4.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  expr = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                   ((BasicExprFactory<std::allocator<char>_> *)&p,0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            ((MutAlgebraicCon *)&sp,
             (NumericExpr)
             expr.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_);
  cols.problem_ = p.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&cols,1);
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&cols,0);
  LVar5 = TestProblem::OnLinearConExpr(&p,0);
  pCVar3 = LVar5.problem_;
  piVar2 = (pCVar3->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  (pCVar3->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = LVar5.con_index_;
  (pCVar3->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = -3.0;
  mp::SPAdapter::SPAdapter(&sp,&p.super_ColProblem);
  MockScenarioHandler::MockScenarioHandler(&handler);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_848,0);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_860,44.0);
  this_00 = MockScenarioHandler::gmock_OnRHS
                      (&handler,(Matcher<int> *)&local_848,(Matcher<double> *)&local_860);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (this_00,"/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",
             0x249,"handler","OnRHS(0, 44)");
  testing::internal::MatcherBase<double>::~MatcherBase(&local_860);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_848);
  mp::SPAdapter::GetScenario<MockScenarioHandler>(&sp,0,&handler);
  MockScenarioHandler::~MockScenarioHandler(&handler);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem(&p.super_ColProblem);
  return;
}

Assistant:

TEST(SPTest, RandomRHSInNonlinear) {
  auto header = MakeHeader(2);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0).set_nonlinear_expr(p.MakeVariable(0));
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  cols.Add(0);
  p.OnLinearConExpr(0).AddTerm(0, -3);
  mp::SPAdapter sp(p);
  MockScenarioHandler handler;
  EXPECT_CALL(handler, OnRHS(0, 44));
  sp.GetScenario(0, handler);
}